

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CentralizedFileFormat.cpp
# Opt level: O0

void __thiscall
ser::CentralizedFileFormat::GlobalInfoFromJSON(CentralizedFileFormat *this,JSONNode *node)

{
  MetainfoSet *this_00;
  bool bVar1;
  JSONNode *node_00;
  JSONNode local_28;
  JSONNode local_20;
  const_iterator iter;
  JSONNode *node_local;
  CentralizedFileFormat *this_local;
  
  iter.it = (JSONNode **)node;
  ::JSONNode::begin(&local_20);
  while( true ) {
    ::JSONNode::end(&local_28);
    bVar1 = ::JSONNode::const_iterator::operator!=
                      ((const_iterator *)&local_20,(const_iterator *)&local_28);
    if (!bVar1) break;
    this_00 = (this->super_FileFormat).pGlobalMetainfo_;
    node_00 = ::JSONNode::const_iterator::operator*((const_iterator *)&local_20);
    MetainfoSet::AddNode(this_00,node_00);
    ::JSONNode::const_iterator::operator++((const_iterator *)&local_20);
  }
  return;
}

Assistant:

void CentralizedFileFormat::GlobalInfoFromJSON(const JSONNode& node)
{
    for (JSONNode::const_iterator iter = node.begin(); iter != node.end(); ++iter)
            pGlobalMetainfo_->AddNode(*iter);
}